

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

size_t al_utf8_encode(char *s,int32_t c)

{
  byte bVar1;
  uint32_t uc;
  
  bVar1 = (byte)c;
  if ((uint)c < 0x80) {
    *s = bVar1;
    return 1;
  }
  if ((uint)c < 0x800) {
    *s = (byte)((uint)c >> 6) | 0xc0;
    s[1] = bVar1 & 0x3f | 0x80;
    return 2;
  }
  if ((uint)c < 0x10000) {
    *s = (byte)((uint)c >> 0xc) | 0xe0;
    s[1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    s[2] = bVar1 & 0x3f | 0x80;
    return 3;
  }
  if ((uint)c < 0x110000) {
    *s = (byte)((uint)c >> 0x12) | 0xf0;
    s[1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
    s[3] = bVar1 & 0x3f | 0x80;
    return 4;
  }
  return 0;
}

Assistant:

size_t al_utf8_encode(char s[], int32_t c)
{
   uint32_t uc = c;

   if (uc <= 0x7f) {
      s[0] = uc;
      return 1;
   }

   if (uc <= 0x7ff) {
      s[0] = 0xC0 | ((uc >> 6) & 0x1F);
      s[1] = 0x80 |  (uc       & 0x3F);
      return 2;
   }

   if (uc <= 0xffff) {
      s[0] = 0xE0 | ((uc >> 12) & 0x0F);
      s[1] = 0x80 | ((uc >>  6) & 0x3F);
      s[2] = 0x80 |  (uc        & 0x3F);
      return 3;
   }

   if (uc <= 0x10ffff) {
      s[0] = 0xF0 | ((uc >> 18) & 0x07);
      s[1] = 0x80 | ((uc >> 12) & 0x3F);
      s[2] = 0x80 | ((uc >>  6) & 0x3F);
      s[3] = 0x80 |  (uc        & 0x3F);
      return 4;
   }

   /* Otherwise is illegal. */
   return 0;
}